

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O0

void editions_unittest::TestDelimited::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestDelimited **v1;
  TestDelimited **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestDelimited_LengthPrefixed *pTVar4;
  TestDelimited *pTVar5;
  TestDelimited_GroupLike *pTVar6;
  NotGroupLikeScope *pNVar7;
  MessageImport *pMVar8;
  anon_union_80_1_493b367e_for_TestDelimited_3 *this;
  LogMessage local_158;
  Voidify local_142;
  byte local_141;
  LogMessage local_140;
  Voidify local_12a;
  byte local_129;
  LogMessage local_128;
  Voidify local_112;
  byte local_111;
  LogMessage local_110;
  Voidify local_fa;
  byte local_f9;
  LogMessage local_f8;
  Voidify local_e2;
  byte local_e1;
  LogMessage local_e0;
  Voidify local_c9;
  uint local_c8;
  uint32_t cached_has_bits;
  LogMessage local_b8;
  Voidify local_a1;
  TestDelimited *local_a0;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestDelimited *from;
  TestDelimited *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_60;
  char *local_58;
  Nullable<const_char_*> local_50;
  Chunk *local_48;
  Nullable<const_char_*> local_40;
  char *local_38;
  Nullable<const_char_*> local_30;
  CleanupNode *local_28;
  Nullable<const_char_*> local_20;
  CleanupNode *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestDelimited *)to_msg;
  _this = (TestDelimited *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_a0 = (TestDelimited *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<editions_unittest::TestDelimited_const*>(&local_a0);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<editions_unittest::TestDelimited*>
                 (&from);
  local_98 = absl::lts_20250127::log_internal::
             Check_NEImpl<editions_unittest::TestDelimited_const*,editions_unittest::TestDelimited*>
                       (v1,v2,"&from != _this");
  if (local_98 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_98);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
               ,0x810,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b8);
  }
  local_c8 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).first_owner_,0);
  local_c8 = *puVar3;
  if ((local_c8 & 0x3f) != 0) {
    if ((local_c8 & 1) != 0) {
      local_e1 = 0;
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x817,"from._impl_.lengthprefixed_ != nullptr");
        local_e1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar2);
      }
      if ((local_e1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((from->field_0)._impl_.lengthprefixed_ == (TestDelimited_LengthPrefixed *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_60 = absl_log_internal_check_op_result;
        pTVar4 = (TestDelimited_LengthPrefixed *)
                 google::protobuf::Arena::
                 CopyConstruct<editions_unittest::TestDelimited_LengthPrefixed>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.lengthprefixed_ = pTVar4;
      }
      else {
        TestDelimited_LengthPrefixed::MergeFrom
                  ((from->field_0)._impl_.lengthprefixed_,
                   (TestDelimited_LengthPrefixed *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_c8 & 2) != 0) {
      local_f9 = 0;
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x81f,"from._impl_.nested_ != nullptr");
        local_f9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_e2,pLVar2);
      }
      if ((local_f9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_f8);
      }
      if ((from->field_0)._impl_.nested_ == (TestDelimited *)0x0) {
        local_58 = (arena->impl_).first_arena_.limit_;
        local_50 = absl_log_internal_check_op_result;
        pTVar5 = (TestDelimited *)
                 google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited>
                           ((Arena *)absl_log_internal_check_op_result,local_58);
        (from->field_0)._impl_.nested_ = pTVar5;
      }
      else {
        MergeFrom((from->field_0)._impl_.nested_,(TestDelimited *)(arena->impl_).first_arena_.limit_
                 );
      }
    }
    if ((local_c8 & 4) != 0) {
      local_111 = 0;
      if ((arena->impl_).first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x827,"from._impl_.grouplike_ != nullptr");
        local_111 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_fa,pLVar2);
      }
      if ((local_111 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_110);
      }
      if ((from->field_0)._impl_.grouplike_ == (TestDelimited_GroupLike *)0x0) {
        local_38 = (arena->impl_).first_arena_.prefetch_ptr_;
        local_30 = absl_log_internal_check_op_result;
        pTVar6 = (TestDelimited_GroupLike *)
                 google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited_GroupLike>
                           ((Arena *)absl_log_internal_check_op_result,local_38);
        (from->field_0)._impl_.grouplike_ = pTVar6;
      }
      else {
        TestDelimited_GroupLike::MergeFrom
                  ((from->field_0)._impl_.grouplike_,
                   (TestDelimited_GroupLike *)(arena->impl_).first_arena_.prefetch_ptr_);
      }
    }
    if ((local_c8 & 8) != 0) {
      local_129 = 0;
      if ((arena->impl_).first_arena_.cleanup_list_.head_ == (Chunk *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_128,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x82f,"from._impl_.notgrouplike_ != nullptr");
        local_129 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_112,pLVar2);
      }
      if ((local_129 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_128);
      }
      if ((from->field_0)._impl_.notgrouplike_ == (TestDelimited_GroupLike *)0x0) {
        local_48 = (arena->impl_).first_arena_.cleanup_list_.head_;
        local_40 = absl_log_internal_check_op_result;
        pTVar6 = (TestDelimited_GroupLike *)
                 google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited_GroupLike>
                           ((Arena *)absl_log_internal_check_op_result,local_48);
        (from->field_0)._impl_.notgrouplike_ = pTVar6;
      }
      else {
        TestDelimited_GroupLike::MergeFrom
                  ((from->field_0)._impl_.notgrouplike_,
                   (TestDelimited_GroupLike *)(arena->impl_).first_arena_.cleanup_list_.head_);
      }
    }
    if ((local_c8 & 0x10) != 0) {
      local_141 = 0;
      if ((arena->impl_).first_arena_.cleanup_list_.next_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_140,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x837,"from._impl_.notgrouplikescope_ != nullptr");
        local_141 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_140);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_12a,pLVar2);
      }
      if ((local_141 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_140);
      }
      if ((from->field_0)._impl_.notgrouplikescope_ == (NotGroupLikeScope *)0x0) {
        local_28 = (arena->impl_).first_arena_.cleanup_list_.next_;
        local_20 = absl_log_internal_check_op_result;
        pNVar7 = (NotGroupLikeScope *)
                 google::protobuf::Arena::CopyConstruct<editions_unittest::NotGroupLikeScope>
                           ((Arena *)absl_log_internal_check_op_result,local_28);
        (from->field_0)._impl_.notgrouplikescope_ = pNVar7;
      }
      else {
        NotGroupLikeScope::MergeFrom
                  ((from->field_0)._impl_.notgrouplikescope_,
                   (NotGroupLikeScope *)(arena->impl_).first_arena_.cleanup_list_.next_);
      }
    }
    if ((local_c8 & 0x20) != 0) {
      if ((arena->impl_).first_arena_.cleanup_list_.limit_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
                   ,0x83f,"from._impl_.messageimport_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_158);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_142,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_158);
      }
      if ((from->field_0)._impl_.messageimport_ == (MessageImport *)0x0) {
        local_18 = (arena->impl_).first_arena_.cleanup_list_.limit_;
        local_10 = absl_log_internal_check_op_result;
        pMVar8 = (MessageImport *)
                 google::protobuf::Arena::CopyConstruct<editions_unittest::MessageImport>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.messageimport_ = pMVar8;
      }
      else {
        MessageImport::MergeFrom
                  ((from->field_0)._impl_.messageimport_,
                   (MessageImport *)(arena->impl_).first_arena_.cleanup_list_.limit_);
      }
    }
  }
  uVar1 = local_c8;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this = &from->field_0;
  pTVar5 = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(this->_impl_)._extensions_,(MessageLite *)pTVar5,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestDelimited::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDelimited*>(&to_msg);
  auto& from = static_cast<const TestDelimited&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:editions_unittest.TestDelimited)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.lengthprefixed_ != nullptr);
      if (_this->_impl_.lengthprefixed_ == nullptr) {
        _this->_impl_.lengthprefixed_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lengthprefixed_);
      } else {
        _this->_impl_.lengthprefixed_->MergeFrom(*from._impl_.lengthprefixed_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.grouplike_ != nullptr);
      if (_this->_impl_.grouplike_ == nullptr) {
        _this->_impl_.grouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.grouplike_);
      } else {
        _this->_impl_.grouplike_->MergeFrom(*from._impl_.grouplike_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplike_ != nullptr);
      if (_this->_impl_.notgrouplike_ == nullptr) {
        _this->_impl_.notgrouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplike_);
      } else {
        _this->_impl_.notgrouplike_->MergeFrom(*from._impl_.notgrouplike_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplikescope_ != nullptr);
      if (_this->_impl_.notgrouplikescope_ == nullptr) {
        _this->_impl_.notgrouplikescope_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplikescope_);
      } else {
        _this->_impl_.notgrouplikescope_->MergeFrom(*from._impl_.notgrouplikescope_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.messageimport_ != nullptr);
      if (_this->_impl_.messageimport_ == nullptr) {
        _this->_impl_.messageimport_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messageimport_);
      } else {
        _this->_impl_.messageimport_->MergeFrom(*from._impl_.messageimport_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}